

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PrefixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  Compilation *expr;
  bool bVar1;
  ExpressionSyntax *syntax_00;
  Type *args_1;
  Expression *pEVar2;
  logic_error *this;
  SourceLocation location;
  Diagnostic *diag_00;
  bool local_259;
  Type *local_250;
  Type *local_248;
  Diagnostic *diag;
  string local_1d8;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  bitmask<slang::ast::AssignFlags> local_fc;
  SourceLocation local_f8;
  Type *local_f0;
  SourceRange local_e8;
  DiagCode local_d4;
  bitmask<slang::ast::ASTFlags> local_d0;
  bitmask<slang::ast::ASTFlags> local_c8;
  bitmask<slang::ast::ASTFlags> local_c0;
  Type *local_b8;
  Type *local_b0;
  Type *local_a8;
  Type *local_a0;
  Type *local_98;
  Type *local_90;
  byte local_81;
  undefined1 auStack_80 [7];
  bool good;
  SourceRange local_70;
  Compilation *local_60;
  UnaryExpression *result;
  Type *type;
  Expression *local_48;
  Expression *operand;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> extraFlags;
  UnaryOperator op;
  ASTContext *context_local;
  PrefixUnaryExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  extraFlags.m_bits._4_4_ =
       Expression::getUnaryOperator((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38);
  bVar1 = anon_unknown.dwarf_df6558::isLValueOp(extraFlags.m_bits._4_4_);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&operand,LValue);
    local_38.m_bits = (underlying_type)operand;
  }
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->operand);
  type = (Type *)local_38.m_bits;
  local_48 = Expression::create(compilation,syntax_00,context,local_38,(Type *)0x0);
  args_1 = not_null::operator_cast_to_Type_((not_null *)&local_48->type);
  pEVar2 = local_48;
  result = (UnaryExpression *)args_1;
  local_70 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_60 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,
                        (UnaryOperator *)((long)&extraFlags.m_bits + 4),args_1,pEVar2,&local_70);
  bVar1 = Expression::bad(local_48);
  expr = local_60;
  if (bVar1) {
    pEVar2 = Expression::badExpr(compilation,(Expression *)local_60);
    return pEVar2;
  }
  _auStack_80 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&syntax->attributes);
  ASTContext::setAttributes(context,(Expression *)expr,_auStack_80);
  switch((syntax->super_ExpressionSyntax).super_SyntaxNode.kind) {
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
    local_81 = Type::isIntegral((Type *)result);
    bVar1 = Type::isFourState((Type *)result);
    if (bVar1) {
      local_250 = Compilation::getLogicType(compilation);
    }
    else {
      local_250 = Compilation::getBitType(compilation);
    }
    local_b8 = local_250;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_b0,&local_b8);
    (((Expression *)&local_60->super_BumpAllocator)->type).ptr = local_b0;
    Expression::selfDetermined(context,(Expression **)&(local_60->options).allowHierarchicalConst);
    break;
  case UnaryBitwiseNotExpression:
    local_81 = Type::isIntegral((Type *)result);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
              ((not_null<slang::ast::Type_const*> *)&local_a8,(Type **)&result);
    (((Expression *)&local_60->super_BumpAllocator)->type).ptr = local_a8;
    break;
  case UnaryLogicalNotExpression:
    local_81 = Type::isNumeric((Type *)result);
    bVar1 = Type::isFourState((Type *)result);
    if (bVar1) {
      local_248 = Compilation::getLogicType(compilation);
    }
    else {
      local_248 = Compilation::getBitType(compilation);
    }
    local_a0 = local_248;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_98,&local_a0);
    (((Expression *)&local_60->super_BumpAllocator)->type).ptr = local_98;
    Expression::selfDetermined(context,(Expression **)&(local_60->options).allowHierarchicalConst);
    break;
  case UnaryMinusExpression:
  case UnaryPlusExpression:
    local_81 = Type::isNumeric((Type *)result);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
              ((not_null<slang::ast::Type_const*> *)&local_90,(Type **)&result);
    (((Expression *)&local_60->super_BumpAllocator)->type).ptr = local_90;
    break;
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
    bitmask<slang::ast::ASTFlags>::bitmask(&local_c0,NonProcedural);
    bVar1 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_c0);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_c8,AssignmentAllowed);
      bVar1 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_c8);
      local_259 = true;
      if (bVar1) goto LAB_00684c2d;
    }
    else {
LAB_00684c2d:
      bitmask<slang::ast::ASTFlags>::bitmask(&local_d0,AssignmentDisallowed);
      local_259 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_d0);
    }
    if (local_259 != false) {
      local_d4.subsystem = Expressions;
      local_d4.code = 0x50;
      local_e8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,local_d4,local_e8);
      pEVar2 = Expression::badExpr(compilation,(Expression *)local_60);
      return pEVar2;
    }
    local_81 = Type::isNumeric((Type *)result);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
              ((not_null<slang::ast::Type_const*> *)&local_f0,(Type **)&result);
    pEVar2 = local_48;
    (((Expression *)&local_60->super_BumpAllocator)->type).ptr = local_f0;
    local_f8 = parsing::Token::location(&syntax->operatorToken);
    memset(&local_fc,0,4);
    bitmask<slang::ast::AssignFlags>::bitmask(&local_fc);
    bVar1 = Expression::requireLValue
                      (pEVar2,context,local_f8,local_fc,(Expression *)0x0,(EvalContext *)0x0);
    if (!bVar1) {
      pEVar2 = Expression::badExpr(compilation,(Expression *)local_60);
      return pEVar2;
    }
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_1a1);
    std::operator+(&local_180,&local_1a0,":");
    std::__cxx11::to_string(&local_1d8,0x173);
    std::operator+(&local_160,&local_180,&local_1d8);
    std::operator+(&local_140,&local_160,": ");
    std::operator+(&local_120,&local_140,"Default case should be unreachable!");
    std::logic_error::logic_error(this,(string *)&local_120);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((local_81 & 1) == 0) {
    location = parsing::Token::location(&syntax->operatorToken);
    diag_00 = ASTContext::addDiag(context,(DiagCode)0x310007,location);
    ast::operator<<(diag_00,(Type *)result);
    Diagnostic::operator<<(diag_00,local_48->sourceRange);
    compilation_local = (Compilation *)Expression::badExpr(compilation,(Expression *)local_60);
  }
  else {
    compilation_local = local_60;
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PrefixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    auto op = getUnaryOperator(syntax.kind);
    bitmask<ASTFlags> extraFlags;
    if (isLValueOp(op))
        extraFlags = ASTFlags::LValue;

    Expression& operand = create(compilation, *syntax.operand, context, extraFlags);
    const Type* type = operand.type;

    auto result = compilation.emplace<UnaryExpression>(op, *type, operand, syntax.sourceRange());
    if (operand.bad())
        return badExpr(compilation, result);

    context.setAttributes(*result, syntax.attributes);

    bool good;
    switch (syntax.kind) {
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
            // Supported for both integral and real types. Result is same as input type.
            good = type->isNumeric();
            result->type = type;
            break;
        case SyntaxKind::UnaryLogicalNotExpression:
            // Supported for both integral and real types. Result is a single bit.
            good = type->isNumeric();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryBitwiseNotExpression:
            // Supported for integral only. Result is same as input type.
            good = type->isIntegral();
            result->type = type;
            break;
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
            // Supported for integral only. Result type is always a single bit.
            good = type->isIntegral();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            if ((context.flags.has(ASTFlags::NonProcedural) &&
                 !context.flags.has(ASTFlags::AssignmentAllowed)) ||
                context.flags.has(ASTFlags::AssignmentDisallowed)) {
                context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
                return badExpr(compilation, result);
            }

            // Supported for both integral and real types. Result is same as input type.
            // The operand must also be an assignable lvalue.
            // TODO: detect and warn for multiple reads and writes of a single variable in an
            // expression
            good = type->isNumeric();
            result->type = type;
            if (!operand.requireLValue(context, syntax.operatorToken.location())) {
                return badExpr(compilation, result);
            }

            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}